

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_SetupBackwardInit(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  MinRegMan_t *pMVar3;
  Vec_Ptr_t *vFanins;
  void **ppvVar4;
  Abc_Ntk_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  long lVar9;
  Abc_NtkFunc_t Func;
  Abc_NtkType_t Type;
  int iVar10;
  
  vFanins = (Vec_Ptr_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vFanins->pArray = ppvVar4;
  Type = pNtk->ntkType;
  if (Type == ABC_NTK_STRASH) {
    Type = ABC_NTK_LOGIC;
  }
  else {
    Func = pNtk->ntkFunc;
    if (Func != ABC_FUNC_MAP) goto LAB_004d3dd6;
  }
  Func = ABC_FUNC_SOP;
LAB_004d3dd6:
  pAVar5 = Abc_NtkAlloc(Type,Func,1);
  pManMR->pInitNtk = pAVar5;
  pVVar6 = pNtk->vBoxes;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar9];
      if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 8) {
        pAVar7 = Abc_NtkCreateObj(pManMR->pInitNtk,ABC_OBJ_PI);
        if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
        }
        if (*(long *)((long)pvVar2 + 0x38) == 2) {
          uVar1 = vFanins->nCap;
          pAVar8 = pAVar7;
          if (vFanins->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vFanins->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(vFanins->pArray,0x80);
              }
              iVar10 = 0x10;
            }
            else {
              iVar10 = uVar1 * 2;
              if (iVar10 <= (int)uVar1) goto LAB_004d3f41;
              if (vFanins->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(vFanins->pArray,(ulong)uVar1 << 4);
              }
            }
LAB_004d3f3a:
            vFanins->pArray = ppvVar4;
            vFanins->nCap = iVar10;
          }
LAB_004d3f41:
          iVar10 = vFanins->nSize;
          vFanins->nSize = iVar10 + 1;
          vFanins->pArray[iVar10] = pAVar8;
        }
        else if (*(long *)((long)pvVar2 + 0x38) == 1) {
          pAVar8 = Abc_NtkCreateNodeInv(pManMR->pInitNtk,pAVar7);
          uVar1 = vFanins->nCap;
          if (vFanins->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vFanins->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(vFanins->pArray,0x80);
              }
              iVar10 = 0x10;
            }
            else {
              iVar10 = uVar1 * 2;
              if (iVar10 <= (int)uVar1) goto LAB_004d3f41;
              if (vFanins->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(vFanins->pArray,(ulong)uVar1 << 4);
              }
            }
            goto LAB_004d3f3a;
          }
          goto LAB_004d3f41;
        }
        *(Abc_Obj_t **)((long)pvVar2 + 0x38) = pAVar7;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vBoxes;
    } while (lVar9 < pVVar6->nSize);
  }
  pMVar3 = pManMR;
  if (vFanins->nSize == 0) {
    pManMR->fSolutionIsDc = 1;
    return;
  }
  pManMR->fSolutionIsDc = 0;
  pAVar7 = Abc_NtkCreateNodeAnd(pMVar3->pInitNtk,vFanins);
  pAVar8 = Abc_NtkCreateObj(pManMR->pInitNtk,ABC_OBJ_PO);
  Abc_ObjAddFanin(pAVar8,pAVar7);
  if (vFanins->pArray != (void **)0x0) {
    free(vFanins->pArray);
    vFanins->pArray = (void **)0x0;
  }
  free(vFanins);
  return;
}

Assistant:

void Abc_FlowRetime_SetupBackwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pLatch, *pObj, *pPi;
  int i;
  Vec_Ptr_t *vObj = Vec_PtrAlloc(100);

  // create the network used for the initial state computation
  if (Abc_NtkIsStrash(pNtk)) {
    pManMR->pInitNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
  } else if (Abc_NtkHasMapping(pNtk))
    pManMR->pInitNtk = Abc_NtkAlloc( pNtk->ntkType, ABC_FUNC_SOP, 1 );
  else
    pManMR->pInitNtk = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );

  // mitre inputs
  Abc_NtkForEachLatch( pNtk, pLatch, i ) {
    // map latch to initial state network
    pPi = Abc_NtkCreatePi( pManMR->pInitNtk );

    // DEBUG
    // printf("setup : mapping latch %d to PI %d\n", pLatch->Id, pPi->Id);

    // has initial state requirement?
    if (Abc_LatchIsInit0(pLatch)) {
      pObj = Abc_NtkCreateNodeInv( pManMR->pInitNtk, pPi );
      Vec_PtrPush(vObj, pObj);
    }
    else if (Abc_LatchIsInit1(pLatch)) {
      Vec_PtrPush(vObj, pPi);
    }
    
    Abc_ObjSetData( pLatch, pPi );     // if not verifying init state
    // FDATA(pLatch)->pInitObj = pPi;  // if verifying init state
  }

  // are there any nodes not DC?
  if (!Vec_PtrSize(vObj)) {
    pManMR->fSolutionIsDc = 1;
    return;
  } else 
    pManMR->fSolutionIsDc = 0;

  // mitre output

  // create n-input AND gate
  pObj = Abc_NtkCreateNodeAnd( pManMR->pInitNtk, vObj );

  Abc_ObjAddFanin( Abc_NtkCreatePo( pManMR->pInitNtk ), pObj );

  Vec_PtrFree( vObj );
}